

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

void fill_borders_for_fbs_on_frame_boundary
               (uint16_t *inbuf,int hfilt_size,int vfilt_size,_Bool is_fb_on_frm_left_boundary,
               _Bool is_fb_on_frm_right_boundary,_Bool is_fb_on_frm_top_boundary,
               _Bool is_fb_on_frm_bottom_boundary)

{
  byte bVar1;
  byte in_CL;
  byte bVar2;
  byte bVar3;
  int in_EDX;
  byte bVar4;
  int in_ESI;
  uint16_t *in_RDI;
  byte in_R8B;
  byte in_R9B;
  byte in_stack_00000008;
  int buf_offset_5;
  int buf_offset_4;
  int buf_offset_3;
  int buf_offset_2;
  int buf_offset_1;
  int buf_offset;
  
  bVar4 = in_CL & 1;
  bVar3 = in_R8B & 1;
  bVar2 = in_R9B & 1;
  bVar1 = in_stack_00000008 & 1;
  if ((((bVar4 == 0) && (bVar3 == 0)) && (bVar2 == 0)) && (bVar1 == 0)) {
    return;
  }
  if (bVar1 == 0) {
    if (bVar4 != 0) goto LAB_013165ad;
  }
  else {
    fill_rect(in_RDI + ((in_EDX + 2) * 0x90 + 8),0x90,2,in_ESI,0x4000);
LAB_013165ad:
    fill_rect(in_RDI + (in_EDX + 2) * 0x90,0x90,2,8,0x4000);
  }
  if ((bVar1 != 0) || (bVar3 != 0)) {
    fill_rect(in_RDI + ((in_EDX + 2) * 0x90 + in_ESI + 8),0x90,2,8,0x4000);
  }
  if (bVar2 == 0) {
    if (bVar4 == 0) goto LAB_0131668e;
  }
  else {
    fill_rect(in_RDI + 8,0x90,2,in_ESI,0x4000);
  }
  fill_rect(in_RDI,0x90,2,8,0x4000);
LAB_0131668e:
  if ((bVar2 != 0) || (bVar3 != 0)) {
    fill_rect(in_RDI + (in_ESI + 8),0x90,2,8,0x4000);
  }
  if (bVar4 != 0) {
    fill_rect(in_RDI + 0x120,0x90,in_EDX,8,0x4000);
  }
  if (bVar3 != 0) {
    fill_rect(in_RDI + (in_ESI + 0x128),0x90,in_EDX,8,0x4000);
  }
  return;
}

Assistant:

static inline void fill_borders_for_fbs_on_frame_boundary(
    uint16_t *inbuf, int hfilt_size, int vfilt_size,
    bool is_fb_on_frm_left_boundary, bool is_fb_on_frm_right_boundary,
    bool is_fb_on_frm_top_boundary, bool is_fb_on_frm_bottom_boundary) {
  if (!is_fb_on_frm_left_boundary && !is_fb_on_frm_right_boundary &&
      !is_fb_on_frm_top_boundary && !is_fb_on_frm_bottom_boundary)
    return;
  if (is_fb_on_frm_bottom_boundary) {
    // Fill bottom region of the block
    const int buf_offset =
        (vfilt_size + CDEF_VBORDER) * CDEF_BSTRIDE + CDEF_HBORDER;
    fill_rect(&inbuf[buf_offset], CDEF_BSTRIDE, CDEF_VBORDER, hfilt_size,
              CDEF_VERY_LARGE);
  }
  if (is_fb_on_frm_bottom_boundary || is_fb_on_frm_left_boundary) {
    const int buf_offset = (vfilt_size + CDEF_VBORDER) * CDEF_BSTRIDE;
    // Fill bottom-left region of the block
    fill_rect(&inbuf[buf_offset], CDEF_BSTRIDE, CDEF_VBORDER, CDEF_HBORDER,
              CDEF_VERY_LARGE);
  }
  if (is_fb_on_frm_bottom_boundary || is_fb_on_frm_right_boundary) {
    const int buf_offset =
        (vfilt_size + CDEF_VBORDER) * CDEF_BSTRIDE + hfilt_size + CDEF_HBORDER;
    // Fill bottom-right region of the block
    fill_rect(&inbuf[buf_offset], CDEF_BSTRIDE, CDEF_VBORDER, CDEF_HBORDER,
              CDEF_VERY_LARGE);
  }
  if (is_fb_on_frm_top_boundary) {
    // Fill top region of the block
    fill_rect(&inbuf[CDEF_HBORDER], CDEF_BSTRIDE, CDEF_VBORDER, hfilt_size,
              CDEF_VERY_LARGE);
  }
  if (is_fb_on_frm_top_boundary || is_fb_on_frm_left_boundary) {
    // Fill top-left region of the block
    fill_rect(inbuf, CDEF_BSTRIDE, CDEF_VBORDER, CDEF_HBORDER, CDEF_VERY_LARGE);
  }
  if (is_fb_on_frm_top_boundary || is_fb_on_frm_right_boundary) {
    const int buf_offset = hfilt_size + CDEF_HBORDER;
    // Fill top-right region of the block
    fill_rect(&inbuf[buf_offset], CDEF_BSTRIDE, CDEF_VBORDER, CDEF_HBORDER,
              CDEF_VERY_LARGE);
  }
  if (is_fb_on_frm_left_boundary) {
    const int buf_offset = CDEF_VBORDER * CDEF_BSTRIDE;
    // Fill left region of the block
    fill_rect(&inbuf[buf_offset], CDEF_BSTRIDE, vfilt_size, CDEF_HBORDER,
              CDEF_VERY_LARGE);
  }
  if (is_fb_on_frm_right_boundary) {
    const int buf_offset = CDEF_VBORDER * CDEF_BSTRIDE;
    // Fill right region of the block
    fill_rect(&inbuf[buf_offset + hfilt_size + CDEF_HBORDER], CDEF_BSTRIDE,
              vfilt_size, CDEF_HBORDER, CDEF_VERY_LARGE);
  }
}